

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpconvert_topng.c
# Opt level: O2

int convert_topng(yabmpconvert_parameters *parameters,yabmp *bmp_reader,yabmp_info *bmp_info)

{
  yabmp_malloc_cb p_Var1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  FILE *__stream;
  long lVar7;
  __jmp_buf_tag *__env;
  size_t __size;
  void *pvVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  png_infop ppVar12;
  size_t sStackY_400;
  ulong uVar13;
  ulong in_stack_fffffffffffffc10;
  yabmp_uint32 l_height;
  uint local_3c8;
  uint red_bits;
  uint blue_bits;
  uint l_bit_depth;
  long local_3b8;
  void *l_buffer;
  uint alpha_bits;
  uint green_bits;
  png_infop local_3a0;
  yabmp_q16d16 gb;
  yabmp_q16d16 gg;
  yabmp_q16d16 gr;
  uint l_color_profile_intent;
  uint l_color_profile_type;
  uint l_scan_direction;
  yabmp_uint32 l_compression_type;
  uint l_color_type;
  yabmp_uint32 l_res_y;
  yabmp_uint32 l_res_x;
  yabmp_uint32 l_width;
  yabmp_color *l_bmp_palette;
  uint local_360;
  png_infop l_png_info;
  uint l_num_palette;
  uint local_348;
  void *local_340;
  png_color l_png_palette [256];
  
  l_buffer = (void *)0x0;
  l_png_info = (png_infop)0x0;
  if (parameters == (yabmpconvert_parameters *)0x0) {
    pcVar11 = "parameters != NULL";
    uVar9 = 0x79;
LAB_001035d9:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/bin/yabmpconvert/yabmpconvert_topng.c"
                  ,uVar9,"int convert_topng(const yabmpconvert_parameters *, yabmp *, yabmp_info *)"
                 );
  }
  if (bmp_reader == (yabmp *)0x0) {
    pcVar11 = "bmp_reader != NULL";
    uVar9 = 0x7a;
    goto LAB_001035d9;
  }
  if (bmp_info == (yabmp_info *)0x0) {
    pcVar11 = "bmp_info != NULL";
    uVar9 = 0x7b;
    goto LAB_001035d9;
  }
  yabmp_get_color_type(bmp_reader,bmp_info,&l_color_type);
  yabmp_get_compression_type(bmp_reader,bmp_info,&l_compression_type);
  yabmp_get_scan_direction(bmp_reader,bmp_info,&l_scan_direction);
  yabmp_get_color_profile_type(bmp_reader,bmp_info,&l_color_profile_type);
  yabmp_get_color_profile_intent(bmp_reader,bmp_info,&l_color_profile_intent);
  switch(l_color_type) {
  case 1:
    if ((parameters->field_0x20 & 8) != 0) goto switchD_00102d15_caseD_a;
    if ((parameters->field_0x20 & 0x10) == 0) {
      yabmp_set_expand_to_grayscale(bmp_reader);
    }
    break;
  case 2:
    break;
  case 3:
    if ((parameters->field_0x20 & 8) != 0) goto switchD_00102d15_caseD_a;
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
    goto switchD_00102d15_caseD_4;
  default:
    if (l_color_type != 0xe) goto switchD_00102d15_caseD_4;
  case 10:
switchD_00102d15_caseD_a:
    yabmp_set_expand_to_bgrx(bmp_reader);
  }
  bVar5 = true;
  if (l_scan_direction == 0) {
    if ((l_compression_type == 0) && ((parameters->field_0x20 & 0x20) == 0)) {
      iVar6 = yabmp_set_invert_scan_direction(bmp_reader);
      if (iVar6 != 0) {
        return 1;
      }
    }
    else {
      bVar5 = false;
    }
  }
  yabmp_read_update_info(bmp_reader,bmp_info);
  yabmp_get_color_type(bmp_reader,bmp_info,&l_color_type);
  yabmp_get_dimensions(bmp_reader,bmp_info,&l_width,&l_height);
  yabmp_get_pixels_per_meter(bmp_reader,bmp_info,&l_res_x,&l_res_y);
  yabmp_get_bit_depth(bmp_reader,bmp_info,&l_bit_depth);
  yabmp_get_bits(bmp_reader,bmp_info,&blue_bits,&green_bits,&red_bits,&alpha_bits);
  if (6 < l_color_type) {
switchD_00102d15_caseD_4:
    if ((parameters->field_0x20 & 4) == 0) {
      fwrite("ERROR: Transcoding not supported.\n",0x22,1,_stderr);
    }
    return 1;
  }
  if ((0x45U >> (l_color_type & 0x1f) & 1) == 0) {
    if ((10U >> (l_color_type & 0x1f) & 1) == 0) goto switchD_00102d15_caseD_4;
    l_color_type = 3;
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  if ((((blue_bits != l_bit_depth) || (green_bits != l_bit_depth)) || (red_bits != l_bit_depth)) ||
     (bVar4 = true, alpha_bits != 0 && alpha_bits != blue_bits)) {
    bVar4 = false;
  }
  pcVar11 = parameters->output_file;
  local_3c8 = l_color_type;
  if (((*pcVar11 != '-') || (__stream = _stdout, pcVar11[1] != '\0')) &&
     (__stream = fopen(pcVar11,"wb"), __stream == (FILE *)0x0)) {
    if ((parameters->field_0x20 & 4) != 0) {
      return 1;
    }
    fprintf(_stderr,"ERROR: can\'t open file %s for writing\n",parameters->output_file);
    return 1;
  }
  uVar13 = 0;
  lVar7 = png_create_write_struct_2
                    ("1.6.37",0,print_png_error,print_png_warning,parameters,custom_png_malloc,
                     custom_png_free);
  local_3b8 = lVar7;
  if (lVar7 == 0) {
    iVar6 = 1;
    if ((parameters->field_0x20 & 4) == 0) {
      fwrite("ERROR: can\'t create PNG struct\n",0x1f,1,_stderr);
    }
    bVar5 = false;
    goto LAB_001033a9;
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(lVar7,longjmp,200);
  iVar6 = _setjmp(__env);
  if (iVar6 == 0) {
    png_init_io(lVar7,__stream);
    l_png_info = (png_infop)png_create_info_struct(lVar7);
    if (l_png_info == (png_infop)0x0) {
      if ((parameters->field_0x20 & 4) == 0) {
        pcVar11 = "ERROR: can\'t create PNG info struct\n";
        sStackY_400 = 0x24;
LAB_00103561:
        fwrite(pcVar11,sStackY_400,1,_stderr);
      }
    }
    else {
      local_3a0 = l_png_info;
      png_set_IHDR(lVar7,l_png_info,l_width,l_height,l_bit_depth,local_3c8,
                   uVar13 & 0xffffffff00000000,in_stack_fffffffffffffc10 & 0xffffffff00000000,0);
      if (l_res_x != 0 || l_res_y != 0) {
        png_set_pHYs(lVar7,local_3a0,l_res_x,l_res_y,1);
      }
      ppVar12 = local_3a0;
      if (bVar3) {
        iVar6 = yabmp_get_palette(bmp_reader,bmp_info,&l_num_palette);
        if (iVar6 != 0) goto LAB_001033a4;
        if (0x100 < (ulong)l_num_palette) {
          __assert_fail("l_num_palette <= 256U",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/bin/yabmpconvert/yabmpconvert_topng.c"
                        ,0x111,
                        "int convert_topng(const yabmpconvert_parameters *, yabmp *, yabmp_info *)")
          ;
        }
        lVar2 = CONCAT44(l_bmp_palette._4_4_,(uint)l_bmp_palette);
        for (lVar10 = 0; (ulong)l_num_palette * 3 != lVar10; lVar10 = lVar10 + 3) {
          (&l_png_palette[0].blue)[lVar10] = *(png_byte *)(lVar2 + 2 + lVar10);
          (&l_png_palette[0].green)[lVar10] = *(png_byte *)(lVar2 + 1 + lVar10);
          (&l_png_palette[0].red)[lVar10] = *(png_byte *)(lVar2 + lVar10);
        }
        png_set_PLTE(lVar7,ppVar12,l_png_palette);
      }
      if ((!bVar4) && ((local_3c8 & 3) == 2)) {
        l_png_palette._0_8_ = (ulong)CONCAT31(l_png_palette._5_3_,(undefined1)alpha_bits) << 0x20;
        l_png_palette[0].blue = (char)blue_bits + (blue_bits == 0);
        l_png_palette[0].green = (char)green_bits + (green_bits == 0);
        l_png_palette[0].red = (char)red_bits + (red_bits == 0);
        png_set_sBIT(lVar7,ppVar12,l_png_palette);
        l_png_palette[0].blue = (char)red_bits + (red_bits == 0);
        l_png_palette[0].red = (char)blue_bits + (blue_bits == 0);
        png_set_shift(lVar7,l_png_palette);
      }
      if (l_color_profile_type == 1) {
        if (4 < (ulong)l_color_profile_intent) {
          if ((parameters->field_0x20 & 4) == 0) {
            fwrite("ERROR: invalid intent\n",0x16,1,_stderr);
          }
          goto LAB_001033a4;
        }
        png_set_sRGB(lVar7,ppVar12,
                     *(undefined4 *)(&DAT_001044a0 + (ulong)l_color_profile_intent * 4));
      }
      else if (l_color_profile_type == 4) {
        yabmp_get_color_profile_calibration
                  (bmp_reader,bmp_info,l_png_palette,&l_bmp_palette,&l_num_palette,&gr,&gg,&gb);
        png_set_cHRM_XYZ((double)(l_png_palette._0_8_ & 0xffffffff) * 9.313225754828403e-10,
                         (double)((ulong)l_png_palette._0_8_ >> 0x20) * 9.313225754828403e-10,
                         (double)(uint)l_png_palette._8_4_ * 9.313225754828403e-10,
                         (double)(uint)l_bmp_palette * 9.313225754828403e-10,
                         (double)l_bmp_palette._4_4_ * 9.313225754828403e-10,
                         (double)local_360 * 9.313225754828403e-10,
                         (double)l_num_palette * 9.313225754828403e-10,
                         (double)local_348 * 9.313225754828403e-10,lVar7,local_3a0);
        ppVar12 = local_3a0;
        png_set_gAMA((double)(gg + gr + gb) * 5.086263020833333e-06,lVar7,local_3a0);
      }
      else if (l_color_profile_type == 3) {
        l_png_palette[0].red = '\0';
        l_png_palette[0].green = '\0';
        l_png_palette[0].blue = '\0';
        l_png_palette[1].red = '\0';
        l_png_palette[1].green = '\0';
        l_png_palette[1].blue = '\0';
        l_png_palette[2].red = '\0';
        l_png_palette[2].green = '\0';
        yabmp_get_color_profile_icc_data(bmp_reader,bmp_info,l_png_palette);
        png_set_iCCP(lVar7,ppVar12,"bmpiccprofile",0,l_png_palette._0_8_,(uint)l_bmp_palette);
      }
      png_write_info(lVar7,ppVar12);
      if ((local_3c8 | 4) == 6) {
        png_set_bgr(lVar7);
      }
      if (l_bit_depth == 0x10) {
        png_set_swap(lVar7);
      }
      __size = png_get_rowbytes(lVar7,ppVar12);
      yabmp_get_rowbytes(bmp_reader,bmp_info,l_png_palette);
      if (l_png_palette._0_8_ == __size) {
        p_Var1 = parameters->malloc;
        if (bVar5) {
          if (p_Var1 == (yabmp_malloc_cb)0x0) {
            pvVar8 = malloc(__size);
          }
          else {
            pvVar8 = (*p_Var1)((void *)0x0,__size);
          }
          l_buffer = pvVar8;
          if (pvVar8 == (void *)0x0) {
LAB_001034bc:
            if ((parameters->field_0x20 & 4) == 0) {
              pcVar11 = "ERROR: can\'t allocate buffer for 1 line\n";
              sStackY_400 = 0x28;
              goto LAB_00103561;
            }
            goto LAB_001033a4;
          }
          for (uVar9 = 0; uVar9 < l_height; uVar9 = uVar9 + 1) {
            iVar6 = yabmp_read_row(bmp_reader,pvVar8,__size);
            if (iVar6 != 0) goto LAB_001033a4;
            png_write_row(local_3b8,pvVar8);
          }
        }
        else {
          if (p_Var1 == (yabmp_malloc_cb)0x0) {
            pvVar8 = malloc(l_height * __size);
          }
          else {
            pvVar8 = (*p_Var1)((void *)0x0,l_height * __size);
          }
          l_buffer = pvVar8;
          if (pvVar8 == (void *)0x0) goto LAB_001034bc;
          local_340 = pvVar8;
          for (uVar9 = 0; uVar9 < l_height; uVar9 = uVar9 + 1) {
            iVar6 = yabmp_read_row(bmp_reader,pvVar8,__size);
            if (iVar6 != 0) goto LAB_001033a4;
            pvVar8 = (void *)((long)pvVar8 + __size);
          }
          lVar7 = (long)pvVar8 - __size;
          for (uVar9 = 0; pvVar8 = local_340, uVar9 < l_height; uVar9 = uVar9 + 1) {
            png_write_row(local_3b8,lVar7);
            lVar7 = lVar7 - __size;
          }
        }
        if (parameters->free == (yabmp_free_cb)0x0) {
          free(pvVar8);
        }
        else {
          (*parameters->free)((void *)0x0,pvVar8);
        }
        l_buffer = (void *)0x0;
        iVar6 = 0;
        png_write_end(local_3b8,0);
        bVar5 = true;
        goto LAB_001033a9;
      }
      if ((parameters->field_0x20 & 4) == 0) {
        fwrite("ERROR: row bytes not matching between YABMP & PNG\n",0x32,1,_stderr);
      }
    }
  }
LAB_001033a4:
  iVar6 = 1;
  bVar5 = false;
LAB_001033a9:
  if (local_3b8 != 0) {
    png_destroy_write_struct(&local_3b8,&l_png_info);
  }
  if (((__stream != (FILE *)0x0) && (__stream != _stdout)) && (fclose(__stream), !bVar5)) {
    remove(parameters->output_file);
  }
  if (l_buffer != (void *)0x0) {
    if (parameters->free == (yabmp_free_cb)0x0) {
      free(l_buffer);
      return iVar6;
    }
    (*parameters->free)((void *)0x0,l_buffer);
    return iVar6;
  }
  return iVar6;
}

Assistant:

int convert_topng(const yabmpconvert_parameters* parameters, yabmp* bmp_reader, yabmp_info* bmp_info)
{
	int result = EXIT_FAILURE; /* default is fail */
	void* volatile l_buffer = NULL; /* volatile needed because of long jump */
	void* l_buffer_cache;
	size_t l_buffer_size;
	yabmp_uint32 l_width, l_height;
	yabmp_uint32 l_res_x, l_res_y;
	unsigned int l_bit_depth;
	unsigned int l_color_type;
	yabmp_uint32 l_compression_type;
	unsigned int l_scan_direction;
	yabmp_uint32 l_png_color_mask;
	int l_png_has_sBIT = 0;
	unsigned int blue_bits, green_bits, red_bits, alpha_bits;
	unsigned int l_color_profile_type, l_color_profile_intent;
	int l_need_full_image = 0;
		
	png_structp l_png_writer = NULL;
	png_infop l_png_info = NULL;
	FILE* l_output = NULL;
	
	assert(parameters != NULL);
	assert(bmp_reader != NULL);
	assert(bmp_info != NULL);
	
	/* Those calls can't fail with proper arguments */
	(void)yabmp_get_color_type(bmp_reader, bmp_info, &l_color_type);
	(void)yabmp_get_compression_type(bmp_reader, bmp_info, &l_compression_type);
	(void)yabmp_get_scan_direction(bmp_reader, bmp_info, &l_scan_direction);
	(void)yabmp_get_color_profile_type(bmp_reader, bmp_info, &l_color_profile_type);
	(void)yabmp_get_color_profile_intent(bmp_reader, bmp_info, &l_color_profile_intent);
	
	/* Check transforms needed */
	switch (l_color_type)
	{
		case YABMP_COLOR_TYPE_BGR:
			break;
		case YABMP_COLOR_TYPE_BITFIELDS:
			yabmp_set_expand_to_bgrx(bmp_reader); /* always expand to BGR(A) */
			break;
		case YABMP_COLOR_TYPE_BITFIELDS_ALPHA:
			yabmp_set_expand_to_bgrx(bmp_reader); /* always expand to BGR(A) */
			break;
		case YABMP_COLOR_TYPE_PALETTE:
			if (parameters->expand_palette) {
				yabmp_set_expand_to_bgrx(bmp_reader); /* expand to BGR(A) */
			}
			break;
		case YABMP_COLOR_TYPE_GRAY_PALETTE:
			if (parameters->expand_palette) {
				yabmp_set_expand_to_bgrx(bmp_reader); /* always expand to BGR(A) */
			} else if (parameters->keep_gray_palette) {
				/* Nothing to do */
			} else {
				yabmp_set_expand_to_grayscale(bmp_reader); /* always expand to Y8 */
			}
			break;
		default:
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: Transcoding not supported.\n");
			}
			return EXIT_FAILURE;
	}
	switch (l_scan_direction)
	{
		case YABMP_SCAN_BOTTOM_UP:
			switch (l_compression_type) {
				case YABMP_COMPRESSION_NONE:
					if (parameters->no_seek_fn) {
						/* no seek for stdin */
						l_need_full_image = 1;
					} else {
						if (yabmp_set_invert_scan_direction(bmp_reader) != YABMP_OK) {
							return EXIT_FAILURE;
						}
					}
					break;
				default:
					l_need_full_image = 1;
					break;
			}
			break;
		default:
		case YABMP_SCAN_TOP_DOWN:
			break;
	}
	/* Update infos & set PNG parameters */
	yabmp_read_update_info(bmp_reader, bmp_info);
	
	(void)yabmp_get_color_type(bmp_reader, bmp_info, &l_color_type);
	(void)yabmp_get_dimensions(bmp_reader, bmp_info, &l_width, &l_height);
	(void)yabmp_get_pixels_per_meter(bmp_reader, bmp_info, &l_res_x, &l_res_y);
	(void)yabmp_get_bit_depth(bmp_reader, bmp_info, &l_bit_depth);
	(void)yabmp_get_bits(bmp_reader, bmp_info, &blue_bits, &green_bits, &red_bits, &alpha_bits);
	
	switch (l_color_type)
	{
		case YABMP_COLOR_TYPE_BGR:
			l_png_color_mask = PNG_COLOR_TYPE_RGB;
			break;
		case YABMP_COLOR_TYPE_BGR_ALPHA:
			l_png_color_mask = PNG_COLOR_TYPE_RGB_ALPHA;
			break;
		case YABMP_COLOR_TYPE_PALETTE:
		case YABMP_COLOR_TYPE_GRAY_PALETTE:
				l_png_color_mask = PNG_COLOR_TYPE_PALETTE;
			break;
		case YABMP_COLOR_TYPE_GRAY:
				l_png_color_mask = PNG_COLOR_TYPE_GRAY;
			break;
		default:
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: Transcoding not supported.\n");
			}
			return EXIT_FAILURE;
	}
	
	if (
			(blue_bits != l_bit_depth) ||
			(green_bits != l_bit_depth) ||
			(red_bits != l_bit_depth) ||
			((alpha_bits != l_bit_depth) && (alpha_bits != 0))) {
		l_png_has_sBIT = 1;
	}
	
	if ((parameters->output_file[0] == '-') && (parameters->output_file[1] == '\0')) {
		stream_setmode_binary(stdout, parameters->quiet);
		l_output = stdout;
	}
	else {
		l_output = fopen(parameters->output_file, "wb");
		if (l_output == NULL) {
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: can't open file %s for writing\n", parameters->output_file);
			}
			return EXIT_FAILURE;
		}
	}
	
	l_png_writer = png_create_write_struct_2(PNG_LIBPNG_VER_STRING, NULL, print_png_error, print_png_warning, (png_voidp)parameters, custom_png_malloc, custom_png_free);
	if (l_png_writer == NULL) {
		if (!parameters->quiet) {
			fprintf(stderr, "ERROR: can't create PNG struct\n");
		}
		goto BADEND;
	}
	if (setjmp(png_jmpbuf(l_png_writer))) {
		goto BADEND;
	}
	/* errors here will generate long jump */
	png_init_io(l_png_writer, l_output);
	l_png_info = png_create_info_struct(l_png_writer);
	if (l_png_info == NULL) {
		if (!parameters->quiet) {
			fprintf(stderr, "ERROR: can't create PNG info struct\n");
		}
		goto BADEND;
	}
		
	png_set_IHDR(l_png_writer, l_png_info, l_width, l_height, (int)l_bit_depth, l_png_color_mask, PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);
	
	if ((l_res_x != 0U) || (l_res_y != 0U)) {
		png_set_pHYs(l_png_writer, l_png_info, l_res_x, l_res_y, PNG_RESOLUTION_METER);
	}
	
	if (l_png_color_mask == PNG_COLOR_TYPE_PALETTE) {
		unsigned int i, l_num_palette;
		const yabmp_color *l_bmp_palette;
		png_color l_png_palette[256];
		
		if(yabmp_get_palette(bmp_reader, bmp_info, &l_num_palette, &l_bmp_palette) != YABMP_OK) {
			goto BADEND;
		}
		assert(l_num_palette <= 256U);
		for (i = 0U; i < l_num_palette; ++i) {
			l_png_palette[i].blue  = l_bmp_palette[i].blue;
			l_png_palette[i].green = l_bmp_palette[i].green;
			l_png_palette[i].red   = l_bmp_palette[i].red;
		}
		
		png_set_PLTE(l_png_writer, l_png_info, l_png_palette, (int)l_num_palette);
	}
		
	if (l_png_has_sBIT) {
		png_color_8 l_sBIT;
		
		if ((l_png_color_mask & ~PNG_COLOR_MASK_ALPHA) == PNG_COLOR_TYPE_RGB) {
			l_sBIT.alpha = alpha_bits;
			l_sBIT.gray  = 0U;
			l_sBIT.blue  = blue_bits ? blue_bits : 1; /* 0 is forbidden, transform deadlocks */
			l_sBIT.green = green_bits ? green_bits : 1;
			l_sBIT.red   = red_bits ? red_bits : 1;
			png_set_sBIT(l_png_writer, l_png_info, &l_sBIT);
			
			/* because of png_set_bgr */
			l_sBIT.blue  = red_bits ? red_bits : 1;
			l_sBIT.red   = blue_bits ? blue_bits : 1;
			png_set_shift(l_png_writer, &l_sBIT);
		}
	}
	
	switch (l_color_profile_type) {
		case YABMP_COLOR_PROFILE_ICC_EMBEDDED:
			{
				yabmp_uint8 const* l_icc_profile = NULL;
				yabmp_uint32 l_icc_profile_len;
				(void)yabmp_get_color_profile_icc_data(bmp_reader, bmp_info, &l_icc_profile, &l_icc_profile_len);
				png_set_iCCP(l_png_writer, l_png_info, "bmpiccprofile", 0, l_icc_profile, l_icc_profile_len);
			}
			break;
		case YABMP_COLOR_PROFILE_sRGB:
			{
				int srgb_intent;
				switch (l_color_profile_intent) {
					case YABMP_COLOR_PROFILE_INTENT_NONE:
					case YABMP_COLOR_PROFILE_INTENT_PERCEPTUAL:
						srgb_intent = 0;
						break;
					case YABMP_COLOR_PROFILE_INTENT_RELCOL:
						srgb_intent = 1;
						break;
					case YABMP_COLOR_PROFILE_INTENT_SATURATION:
						srgb_intent = 2;
						break;
					case YABMP_COLOR_PROFILE_INTENT_ABSCOL:
						srgb_intent = 3;
						break;
					default:
						if (!parameters->quiet) {
							fprintf(stderr, "ERROR: invalid intent\n");
						}
						goto BADEND;
						break;
				}
				png_set_sRGB(l_png_writer, l_png_info, srgb_intent);
			}
			break;
		case YABMP_COLOR_PROFILE_CALIBRATED_RGB:
			{
				yabmp_cie_xyz r, g, b;
				yabmp_q16d16 gr, gg, gb;
				(void)yabmp_get_color_profile_calibration(bmp_reader, bmp_info, &r, &g, &b, &gr, &gg, &gb);
				png_set_cHRM_XYZ(l_png_writer, l_png_info, r.x * (1.0 / 1073741823.0), r.y * (1.0 / 1073741823.0), r.z * (1.0 / 1073741823.0), g.x * (1.0 / 1073741823.0), g.y * (1.0 / 1073741823.0), g.z * (1.0 / 1073741823.0), b.x * (1.0 / 1073741823.0), b.y * (1.0 / 1073741823.0), b.z * (1.0 / 1073741823.0));
				/* how to handle per channel gamma ? */
				/* let's just average for now... */
				png_set_gAMA(l_png_writer, l_png_info, (gr + gg + gb) * (1.0 / (3.0 * 65536.0)));
			}
			break;
		default:
			break;
	}
	
	png_write_info(l_png_writer, l_png_info);
		
	switch (l_png_color_mask) {
		case PNG_COLOR_TYPE_RGB:
		case PNG_COLOR_TYPE_RGB_ALPHA:
			png_set_bgr(l_png_writer);
			break;
		default:
			break;
	}
#if !defined(YABMP_BIG_ENDIAN)
	if (l_bit_depth == 16U) {
		png_set_swap(l_png_writer);
	}
#endif
	
	/* Now deal with the image */
	l_buffer_size = png_get_rowbytes(l_png_writer, l_png_info);
	{
		size_t l_check_buffer_size;
		yabmp_get_rowbytes(bmp_reader, bmp_info, &l_check_buffer_size);
		if (l_check_buffer_size != l_buffer_size) {
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: row bytes not matching between YABMP & PNG\n");
			}
			goto BADEND;
		}
	}
	if (l_need_full_image) {
		/* TODO check overflow */
		l_buffer = l_buffer_cache = parameters->malloc ? parameters->malloc(NULL, l_buffer_size * (size_t)l_height) : malloc(l_buffer_size * (size_t)l_height);
	}
	else {
		l_buffer = l_buffer_cache = parameters->malloc ? parameters->malloc(NULL, l_buffer_size): malloc(l_buffer_size);
	}
	if (l_buffer_cache == NULL) {
		if (!parameters->quiet) {
			fprintf(stderr, "ERROR: can't allocate buffer for 1 line\n");
		}
		goto BADEND;
	}
	if (l_need_full_image) {
		union
		{
			void* buffer;
			yabmp_uint8* buffer8u;
		} l_current_row;
		yabmp_uint32 i;
		
		l_current_row.buffer = l_buffer_cache;
		for (i = 0U; i < l_height; ++i) {
			if (yabmp_read_row(bmp_reader, l_current_row.buffer, l_buffer_size) != YABMP_OK) {
				goto BADEND;
			}
			l_current_row.buffer8u += l_buffer_size;
		}
		for (i = 0U; i < l_height; ++i) {
			l_current_row.buffer8u -= l_buffer_size;
			png_write_row(l_png_writer, l_current_row.buffer);
		}
	}
	else {
		yabmp_uint32 i;
		for (i = 0U; i < l_height; ++i) {
			if (yabmp_read_row(bmp_reader, l_buffer_cache, l_buffer_size) != YABMP_OK) {
				goto BADEND;
			}
			png_write_row(l_png_writer, l_buffer_cache);
		}
	}
	parameters->free ? parameters->free(NULL, l_buffer_cache) : free(l_buffer_cache);
	l_buffer = NULL;
		
	png_write_end(l_png_writer, NULL);
	result = 0;
BADEND:
	if (l_png_writer != NULL) {
		png_destroy_write_struct(&l_png_writer, &l_png_info);
	}
	if ((l_output != NULL) && (l_output != stdout)) {
		fclose(l_output);
		if (result != 0) {
			(void)remove(parameters->output_file);
		}
	}
	l_buffer_cache = l_buffer;
	if (l_buffer_cache != NULL) {
		parameters->free ? parameters->free(NULL, l_buffer_cache) : free(l_buffer_cache);
		l_buffer = NULL;
	}
	return result;
}